

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

QString * qv(ProString *val)

{
  QStringBuilder<char,_QString> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_QString> *b;
  ProString *in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b = in_RDI;
  QMakeEvaluator::quoteValue(in_stack_ffffffffffffffc0);
  operator+(local_28,(QString *)b);
  QStringBuilder::operator_cast_to_QString(in_RDI);
  QStringBuilder<char,_QString>::~QStringBuilder((QStringBuilder<char,_QString> *)0x1841c3);
  QString::~QString((QString *)0x1841cd);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString
qv(const ProString &val)
{
    return ' ' + QMakeEvaluator::quoteValue(val);
}